

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_table.c
# Opt level: O3

int amqp_decode_field_value
              (amqp_bytes_t encoded,amqp_pool_t *pool,amqp_field_value_t *entry,size_t *offset)

{
  ulong uVar1;
  uint8_t uVar2;
  ushort uVar3;
  uint uVar4;
  size_t sVar5;
  int iVar6;
  void *pvVar7;
  void *pvVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  int local_4c;
  
  pvVar7 = encoded.bytes;
  uVar11 = encoded.len;
  sVar5 = *offset;
  uVar1 = sVar5 + 1;
  *offset = uVar1;
  iVar6 = -2;
  if (uVar11 < uVar1) {
    return -2;
  }
  uVar2 = *(uint8_t *)((long)pvVar7 + sVar5);
  entry->kind = uVar2;
  switch(uVar2) {
  case 'A':
    sVar5 = *offset;
    uVar1 = sVar5 + 4;
    *offset = uVar1;
    if (uVar11 < uVar1) {
      return -2;
    }
    uVar4 = *(uint *)((long)pvVar7 + sVar5);
    pvVar7 = malloc(0x180);
    if (pvVar7 == (void *)0x0) {
      return -1;
    }
    uVar11 = (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18) +
             uVar1;
    uVar12 = 0;
    if (uVar1 < uVar11) {
      local_4c = 0x10;
      lVar10 = 0;
      uVar12 = 0;
      do {
        pvVar8 = pvVar7;
        if ((long)local_4c <= (long)uVar12) {
          local_4c = local_4c * 2;
          pvVar8 = realloc(pvVar7,(long)local_4c * 0x18);
          if (pvVar8 == (void *)0x0) {
            iVar6 = -1;
            goto LAB_0010b3d0;
          }
        }
        pvVar7 = pvVar8;
        iVar6 = amqp_decode_field_value
                          (encoded,pool,(amqp_field_value_t *)((long)pvVar7 + lVar10),offset);
        if (iVar6 < 0) goto LAB_0010b3d0;
        uVar12 = uVar12 + 1;
        lVar10 = lVar10 + 0x18;
      } while (*offset < uVar11);
    }
    (entry->value).boolean = (int)uVar12;
    sVar5 = (uVar12 & 0xffffffff) * 0x18;
    pvVar8 = amqp_pool_alloc(pool,sVar5);
    (entry->value).bytes.bytes = pvVar8;
    iVar6 = -1;
    if (pvVar8 != (void *)0x0 || (int)uVar12 == 0) {
      memcpy(pvVar8,pvVar7,sVar5);
      iVar6 = 0;
    }
LAB_0010b3d0:
    free(pvVar7);
    return iVar6;
  case 'B':
switchD_0010b0e8_caseD_62:
    sVar5 = *offset;
    uVar1 = sVar5 + 1;
    *offset = uVar1;
    if (uVar11 < uVar1) {
      return -2;
    }
    (entry->value).i8 = *(int8_t *)((long)pvVar7 + sVar5);
    break;
  case 'C':
  case 'E':
  case 'G':
  case 'H':
  case 'J':
  case 'K':
  case 'M':
  case 'N':
  case 'O':
  case 'P':
  case 'Q':
  case 'R':
  case 'U':
    goto switchD_0010b0e8_caseD_63;
  case 'D':
    sVar5 = *offset;
    uVar1 = sVar5 + 1;
    *offset = uVar1;
    if (uVar11 < uVar1) {
      return -2;
    }
    (entry->value).i8 = *(int8_t *)((long)pvVar7 + sVar5);
    sVar5 = *offset;
    uVar1 = sVar5 + 4;
    *offset = uVar1;
    if (uVar11 < uVar1) {
      return -2;
    }
    uVar4 = *(uint *)((long)pvVar7 + sVar5);
    (entry->value).decimal.value =
         uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    break;
  case 'F':
    iVar6 = amqp_decode_table(encoded,pool,&(entry->value).table,offset);
    return iVar6;
  case 'I':
switchD_0010b0e8_caseD_66:
    sVar5 = *offset;
    uVar1 = sVar5 + 4;
    *offset = uVar1;
    if (uVar11 < uVar1) {
      return -2;
    }
    uVar4 = *(uint *)((long)pvVar7 + sVar5);
    (entry->value).u32 =
         uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    break;
  case 'L':
  case 'T':
switchD_0010b0e8_caseD_64:
    sVar5 = *offset;
    uVar1 = sVar5 + 8;
    *offset = uVar1;
    if (uVar11 < uVar1) {
      return -2;
    }
    uVar1 = *(ulong *)((long)pvVar7 + sVar5);
    (entry->value).u64 =
         uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
         (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
         (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
    break;
  case 'S':
switchD_0010b126_caseD_53:
    sVar5 = *offset;
    uVar1 = sVar5 + 4;
    *offset = uVar1;
    if (uVar11 < uVar1) {
      return -2;
    }
    uVar4 = *(uint *)((long)pvVar7 + sVar5);
    uVar9 = (ulong)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18)
    ;
    uVar12 = uVar1 + uVar9;
    *offset = uVar12;
    if (uVar11 < uVar12) {
      return -2;
    }
    (entry->value).bytes.bytes = (void *)((long)pvVar7 + uVar1);
    (entry->value).i64 = uVar9;
    break;
  case 'V':
    break;
  default:
    switch(uVar2) {
    case 'b':
      goto switchD_0010b0e8_caseD_62;
    case 'c':
    case 'e':
    case 'g':
    case 'h':
    case 'j':
    case 'k':
    case 'm':
    case 'n':
    case 'o':
    case 'p':
    case 'q':
    case 'r':
      goto switchD_0010b0e8_caseD_63;
    case 'd':
    case 'l':
      goto switchD_0010b0e8_caseD_64;
    case 'f':
    case 'i':
      goto switchD_0010b0e8_caseD_66;
    case 's':
    case 'u':
      sVar5 = *offset;
      uVar1 = sVar5 + 2;
      *offset = uVar1;
      if (uVar11 < uVar1) {
        return -2;
      }
      uVar3 = *(ushort *)((long)pvVar7 + sVar5);
      (entry->value).u16 = uVar3 << 8 | uVar3 >> 8;
      break;
    case 't':
      sVar5 = *offset;
      uVar1 = sVar5 + 1;
      *offset = uVar1;
      if (uVar11 < uVar1) {
        return -2;
      }
      *(uint *)&entry->value = (uint)(*(char *)((long)pvVar7 + sVar5) != '\0');
      break;
    default:
      if (uVar2 != 'x') {
        return -2;
      }
      goto switchD_0010b126_caseD_53;
    }
  }
  iVar6 = 0;
switchD_0010b0e8_caseD_63:
  return iVar6;
}

Assistant:

static int amqp_decode_field_value(amqp_bytes_t encoded,
                                   amqp_pool_t *pool,
                                   amqp_field_value_t *entry,
                                   size_t *offset)
{
  int res = AMQP_STATUS_BAD_AMQP_DATA;

  if (!amqp_decode_8(encoded, offset, &entry->kind)) {
    goto out;
  }

#define TRIVIAL_FIELD_DECODER(bits) if (!amqp_decode_##bits(encoded, offset, &entry->value.u##bits)) goto out; break
#define SIMPLE_FIELD_DECODER(bits, dest, how) { uint##bits##_t val; if (!amqp_decode_##bits(encoded, offset, &val)) goto out; entry->value.dest = how; } break

  switch (entry->kind) {
  case AMQP_FIELD_KIND_BOOLEAN:
    SIMPLE_FIELD_DECODER(8, boolean, val ? 1 : 0);

  case AMQP_FIELD_KIND_I8:
    SIMPLE_FIELD_DECODER(8, i8, (int8_t)val);
  case AMQP_FIELD_KIND_U8:
    TRIVIAL_FIELD_DECODER(8);

  case AMQP_FIELD_KIND_I16:
    SIMPLE_FIELD_DECODER(16, i16, (int16_t)val);
  case AMQP_FIELD_KIND_U16:
    TRIVIAL_FIELD_DECODER(16);

  case AMQP_FIELD_KIND_I32:
    SIMPLE_FIELD_DECODER(32, i32, (int32_t)val);
  case AMQP_FIELD_KIND_U32:
    TRIVIAL_FIELD_DECODER(32);

  case AMQP_FIELD_KIND_I64:
    SIMPLE_FIELD_DECODER(64, i64, (int64_t)val);
  case AMQP_FIELD_KIND_U64:
    TRIVIAL_FIELD_DECODER(64);

  case AMQP_FIELD_KIND_F32:
    TRIVIAL_FIELD_DECODER(32);
    /* and by punning, f32 magically gets the right value...! */

  case AMQP_FIELD_KIND_F64:
    TRIVIAL_FIELD_DECODER(64);
    /* and by punning, f64 magically gets the right value...! */

  case AMQP_FIELD_KIND_DECIMAL:
    if (!amqp_decode_8(encoded, offset, &entry->value.decimal.decimals)
        || !amqp_decode_32(encoded, offset, &entry->value.decimal.value)) {
      goto out;
    }
    break;

  case AMQP_FIELD_KIND_UTF8:
    /* AMQP_FIELD_KIND_UTF8 and AMQP_FIELD_KIND_BYTES have the
       same implementation, but different interpretations. */
    /* fall through */
  case AMQP_FIELD_KIND_BYTES: {
    uint32_t len;
    if (!amqp_decode_32(encoded, offset, &len)
        || !amqp_decode_bytes(encoded, offset, &entry->value.bytes, len)) {
      goto out;
    }
    break;
  }

  case AMQP_FIELD_KIND_ARRAY:
    res = amqp_decode_array(encoded, pool, &(entry->value.array), offset);
    goto out;

  case AMQP_FIELD_KIND_TIMESTAMP:
    TRIVIAL_FIELD_DECODER(64);

  case AMQP_FIELD_KIND_TABLE:
    res = amqp_decode_table(encoded, pool, &(entry->value.table), offset);
    goto out;

  case AMQP_FIELD_KIND_VOID:
    break;

  default:
    goto out;
  }

  res = AMQP_STATUS_OK;

out:
  return res;
}